

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

int xmlTextReaderPreservePattern(xmlTextReaderPtr reader,xmlChar *pattern,xmlChar **namespaces)

{
  uint uVar1;
  xmlPatternPtr pxVar2;
  xmlPatternPtr *ppxVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  iVar4 = -1;
  if (pattern == (xmlChar *)0x0 || reader == (xmlTextReaderPtr)0x0) {
    return -1;
  }
  pxVar2 = xmlPatterncompile(pattern,reader->dict,0,namespaces);
  if (pxVar2 == (xmlPatternPtr)0x0) {
    return -1;
  }
  uVar1 = reader->patternMax;
  if (reader->patternNr < (int)uVar1) {
    ppxVar3 = reader->patternTab;
    iVar4 = reader->patternNr;
LAB_0016f7e6:
    ppxVar3[iVar4] = pxVar2;
    reader->patternNr = iVar4 + 1;
  }
  else {
    if ((int)uVar1 < 1) {
      uVar6 = 4;
LAB_0016f7b6:
      ppxVar3 = (xmlPatternPtr *)(*xmlRealloc)(reader->patternTab,(ulong)uVar6 << 3);
      if (ppxVar3 != (xmlPatternPtr *)0x0) {
        reader->patternTab = ppxVar3;
        reader->patternMax = uVar6;
        iVar4 = reader->patternNr;
        goto LAB_0016f7e6;
      }
    }
    else if (uVar1 < 1000000000) {
      uVar5 = uVar1 + 1 >> 1;
      uVar6 = uVar5 + uVar1;
      if (1000000000 - uVar5 < uVar1) {
        uVar6 = 1000000000;
      }
      goto LAB_0016f7b6;
    }
    xmlTextReaderErrMemory(reader);
  }
  return iVar4;
}

Assistant:

int
xmlTextReaderPreservePattern(xmlTextReaderPtr reader, const xmlChar *pattern,
                             const xmlChar **namespaces)
{
    xmlPatternPtr comp;

    if ((reader == NULL) || (pattern == NULL))
	return(-1);

    comp = xmlPatterncompile(pattern, reader->dict, 0, namespaces);
    if (comp == NULL)
        return(-1);

    if (reader->patternNr >= reader->patternMax) {
        xmlPatternPtr *tmp;
        int newSize;

        newSize = xmlGrowCapacity(reader->patternMax, sizeof(tmp[0]),
                                  4, XML_MAX_ITEMS);
        if (newSize < 0) {
            xmlTextReaderErrMemory(reader);
            return(-1);
        }
	tmp = xmlRealloc(reader->patternTab, newSize * sizeof(tmp[0]));
        if (tmp == NULL) {
            xmlTextReaderErrMemory(reader);
            return(-1);
        }
	reader->patternTab = tmp;
        reader->patternMax = newSize;
    }
    reader->patternTab[reader->patternNr] = comp;
    return(reader->patternNr++);
}